

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<void> __thiscall kj::AsyncCapabilityStream::sendFd(AsyncCapabilityStream *this,int fd)

{
  int *node;
  size_t sVar1;
  ArrayDisposer *pAVar2;
  undefined4 uVar3;
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  Promise<void> promise;
  Array<int> fds;
  Array<int> local_50;
  undefined8 *local_38;
  undefined4 *local_30;
  undefined8 uStack_28;
  
  local_50.size_ =
       (size_t)kj::_::HeapArrayDisposer::allocateImpl
                         (4,1,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_50.disposer = (ArrayDisposer *)0x1;
  local_38 = &kj::_::HeapArrayDisposer::instance;
  *(undefined4 *)local_50.size_ = in_EDX;
  uStack_28 = 1;
  local_30._0_4_ = (undefined4)local_50.size_;
  uVar3 = local_30._0_4_;
  local_30 = (undefined4 *)local_50.size_;
  (**(code **)(*(long *)CONCAT44(in_register_00000034,fd) + 0x70))
            (&local_50,(long *)CONCAT44(in_register_00000034,fd),"",1,0,0,uVar3,1);
  Promise<void>::attach<kj::Array<int>>((Promise<void> *)this,&local_50);
  node = local_50.ptr;
  if ((PromiseArenaMember *)local_50.ptr != (PromiseArenaMember *)0x0) {
    local_50.ptr = (int *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  pAVar2 = local_50.disposer;
  sVar1 = local_50.size_;
  if ((undefined4 *)local_50.size_ != (undefined4 *)0x0) {
    local_50.size_ = 0;
    local_50.disposer = (ArrayDisposer *)0x0;
    (**(code **)*local_38)(local_38,sVar1,4,pAVar2,pAVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> AsyncCapabilityStream::sendFd(int fd) {
  static constexpr byte b = 0;
  auto fds = kj::heapArray<int>(1);
  fds[0] = fd;
  auto promise = writeWithFds(arrayPtr(&b, 1), nullptr, fds);
  return promise.attach(kj::mv(fds));
}